

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_font_bake_pack(nk_font_baker *baker,nk_size *image_memory,int *width,int *height,
                     nk_recti *custom,nk_font_config *config_list,int count,nk_allocator *alloc)

{
  nk_font_config *pnVar1;
  int iVar2;
  nk_uint nVar3;
  nk_font_bake_data *info;
  nk_rune *pnVar4;
  int iVar5;
  bool bVar6;
  int local_ac;
  int local_a4;
  nk_font_bake_data *tmp;
  nk_font_config *cfg;
  nk_rune *in_range;
  int glyph_count;
  int n;
  nk_rp_rect custom_space;
  int char_n;
  int rect_n;
  int range_n;
  int input_i;
  int i;
  int range_count;
  int total_range_count;
  int total_glyph_count;
  nk_font_config *it;
  nk_font_config *config_iter;
  nk_font_config *config_list_local;
  nk_recti *custom_local;
  int *height_local;
  int *width_local;
  nk_size *image_memory_local;
  nk_font_baker *baker_local;
  
  range_count = 0;
  i = 0;
  range_n = 0;
  if (image_memory == (nk_size *)0x0) {
    __assert_fail("image_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x316c,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x316d,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x316e,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (config_list == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x316f,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3170,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x3171,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if ((((image_memory == (nk_size *)0x0) || (width == (int *)0x0)) || (height == (int *)0x0)) ||
     ((config_list == (nk_font_config *)0x0 || (it = config_list, count == 0)))) {
    baker_local._4_4_ = 0;
  }
  else {
    for (; pnVar1 = config_list, it != (nk_font_config *)0x0; it = it->next) {
      _total_range_count = it;
      do {
        iVar2 = nk_range_count(_total_range_count->range);
        i = iVar2 + i;
        iVar2 = nk_range_glyph_count(_total_range_count->range,iVar2);
        range_count = iVar2 + range_count;
        _total_range_count = _total_range_count->n;
      } while (_total_range_count != it);
    }
    while (it = pnVar1, it != (nk_font_config *)0x0) {
      _total_range_count = it;
      do {
        iVar5 = range_n + 1;
        iVar2 = nk_tt_InitFont(&baker->build[range_n].info,(uchar *)_total_range_count->ttf_blob,0);
        if (iVar2 == 0) {
          return 0;
        }
        _total_range_count = _total_range_count->n;
        range_n = iVar5;
      } while (_total_range_count != it);
      pnVar1 = it->next;
    }
    *height = 0;
    iVar2 = 0x200;
    if (1000 < range_count) {
      iVar2 = 0x400;
    }
    *width = iVar2;
    nk_tt_PackBegin(&baker->spc,(uchar *)0x0,*width,0x8000,0,1,alloc);
    char_n = 0;
    custom_space.was_packed = 0;
    custom_space.x = 0;
    custom_space.y = 0;
    if (custom != (nk_recti *)0x0) {
      nk_zero(&glyph_count,0x10);
      n._0_2_ = custom->w;
      n._2_2_ = custom->h;
      nk_tt_PackSetOversampling(&baker->spc,1,1);
      nk_rp_pack_rects((nk_rp_context *)(baker->spc).pack_info,(nk_rp_rect *)&glyph_count,1);
      if (*height < (int)((uint)custom_space.id._2_2_ + (uint)n._2_2_)) {
        local_a4 = (uint)custom_space.id._2_2_ + (uint)n._2_2_;
      }
      else {
        local_a4 = *height;
      }
      *height = local_a4;
      custom->x = (short)custom_space.id;
      custom->y = custom_space.id._2_2_;
      custom->w = (short)n;
      custom->h = n._2_2_;
    }
    rect_n = 0;
    for (it = config_list; rect_n < count && it != (nk_font_config *)0x0; it = it->next) {
      _total_range_count = it;
      do {
        iVar2 = rect_n + 1;
        info = baker->build + rect_n;
        in_range._0_4_ = 0;
        input_i = 0;
        cfg = (nk_font_config *)_total_range_count->range;
        while( true ) {
          bVar6 = false;
          if (*(int *)&cfg->next != 0) {
            bVar6 = *(int *)((long)&cfg->next + 4) != 0;
          }
          if (!bVar6) break;
          in_range._0_4_ = (*(int *)((long)&cfg->next + 4) - *(int *)&cfg->next) + 1 + (int)in_range
          ;
          input_i = input_i + 1;
          cfg = (nk_font_config *)&cfg->ttf_blob;
        }
        info->ranges = baker->ranges + char_n;
        info->range_count = input_i;
        char_n = input_i + char_n;
        for (range_n = 0; range_n < input_i; range_n = range_n + 1) {
          pnVar4 = _total_range_count->range + (range_n << 1);
          info->ranges[range_n].font_size = _total_range_count->size;
          info->ranges[range_n].first_unicode_codepoint_in_range = *pnVar4;
          info->ranges[range_n].num_chars = (pnVar4[1] - *pnVar4) + 1;
          info->ranges[range_n].chardata_for_range = baker->packed_chars + (int)custom_space._8_4_;
          custom_space._8_4_ = info->ranges[range_n].num_chars + custom_space._8_4_;
        }
        info->rects = baker->rects + custom_space.was_packed;
        custom_space.was_packed = (int)in_range + custom_space.was_packed;
        nk_tt_PackSetOversampling
                  (&baker->spc,(uint)_total_range_count->oversample_h,
                   (uint)_total_range_count->oversample_v);
        iVar5 = nk_tt_PackFontRangesGatherRects
                          (&baker->spc,&info->info,info->ranges,info->range_count,info->rects);
        nk_rp_pack_rects((nk_rp_context *)(baker->spc).pack_info,info->rects,iVar5);
        for (range_n = 0; range_n < iVar5; range_n = range_n + 1) {
          if (info->rects[range_n].was_packed != 0) {
            if (*height < (int)((uint)info->rects[range_n].y + (uint)info->rects[range_n].h)) {
              local_ac = (uint)info->rects[range_n].y + (uint)info->rects[range_n].h;
            }
            else {
              local_ac = *height;
            }
            *height = local_ac;
          }
        }
        _total_range_count = _total_range_count->n;
        rect_n = iVar2;
      } while (_total_range_count != it);
    }
    if (custom_space.was_packed != range_count) {
      __assert_fail("rect_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x31c9,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    if (custom_space._8_4_ != range_count) {
      __assert_fail("char_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x31ca,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    if (char_n != i) {
      __assert_fail("range_n == total_range_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x31cb,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    nVar3 = nk_round_up_pow2(*height);
    *height = nVar3;
    *image_memory = (long)*width * (long)*height;
    baker_local._4_4_ = 1;
  }
  return baker_local._4_4_;
}

Assistant:

NK_INTERN int
nk_font_bake_pack(struct nk_font_baker *baker,
    nk_size *image_memory, int *width, int *height, struct nk_recti *custom,
    const struct nk_font_config *config_list, int count,
    struct nk_allocator *alloc)
{
    NK_STORAGE const nk_size max_height = 1024 * 32;
    const struct nk_font_config *config_iter, *it;
    int total_glyph_count = 0;
    int total_range_count = 0;
    int range_count = 0;
    int i = 0;

    NK_ASSERT(image_memory);
    NK_ASSERT(width);
    NK_ASSERT(height);
    NK_ASSERT(config_list);
    NK_ASSERT(count);
    NK_ASSERT(alloc);

    if (!image_memory || !width || !height || !config_list || !count) return nk_false;
    for (config_iter = config_list; config_iter; config_iter = config_iter->next) {
        it = config_iter;
        do {range_count = nk_range_count(it->range);
            total_range_count += range_count;
            total_glyph_count += nk_range_glyph_count(it->range, range_count);
        } while ((it = it->n) != config_iter);
    }
    /* setup font baker from temporary memory */
    for (config_iter = config_list; config_iter; config_iter = config_iter->next) {
        it = config_iter;
        do {if (!nk_tt_InitFont(&baker->build[i++].info, (const unsigned char*)it->ttf_blob, 0))
            return nk_false;
        } while ((it = it->n) != config_iter);
    }
    *height = 0;
    *width = (total_glyph_count > 1000) ? 1024 : 512;
    nk_tt_PackBegin(&baker->spc, 0, (int)*width, (int)max_height, 0, 1, alloc);
    {
        int input_i = 0;
        int range_n = 0;
        int rect_n = 0;
        int char_n = 0;

        if (custom) {
            /* pack custom user data first so it will be in the upper left corner*/
            struct nk_rp_rect custom_space;
            nk_zero(&custom_space, sizeof(custom_space));
            custom_space.w = (nk_rp_coord)(custom->w);
            custom_space.h = (nk_rp_coord)(custom->h);

            nk_tt_PackSetOversampling(&baker->spc, 1, 1);
            nk_rp_pack_rects((struct nk_rp_context*)baker->spc.pack_info, &custom_space, 1);
            *height = NK_MAX(*height, (int)(custom_space.y + custom_space.h));

            custom->x = (short)custom_space.x;
            custom->y = (short)custom_space.y;
            custom->w = (short)custom_space.w;
            custom->h = (short)custom_space.h;
        }

        /* first font pass: pack all glyphs */
        for (input_i = 0, config_iter = config_list; input_i < count && config_iter;
            config_iter = config_iter->next) {
            it = config_iter;
            do {int n = 0;
                int glyph_count;
                const nk_rune *in_range;
                const struct nk_font_config *cfg = it;
                struct nk_font_bake_data *tmp = &baker->build[input_i++];

                /* count glyphs + ranges in current font */
                glyph_count = 0; range_count = 0;
                for (in_range = cfg->range; in_range[0] && in_range[1]; in_range += 2) {
                    glyph_count += (int)(in_range[1] - in_range[0]) + 1;
                    range_count++;
                }

                /* setup ranges  */
                tmp->ranges = baker->ranges + range_n;
                tmp->range_count = (nk_rune)range_count;
                range_n += range_count;
                for (i = 0; i < range_count; ++i) {
                    in_range = &cfg->range[i * 2];
                    tmp->ranges[i].font_size = cfg->size;
                    tmp->ranges[i].first_unicode_codepoint_in_range = (int)in_range[0];
                    tmp->ranges[i].num_chars = (int)(in_range[1]- in_range[0]) + 1;
                    tmp->ranges[i].chardata_for_range = baker->packed_chars + char_n;
                    char_n += tmp->ranges[i].num_chars;
                }

                /* pack */
                tmp->rects = baker->rects + rect_n;
                rect_n += glyph_count;
                nk_tt_PackSetOversampling(&baker->spc, cfg->oversample_h, cfg->oversample_v);
                n = nk_tt_PackFontRangesGatherRects(&baker->spc, &tmp->info,
                    tmp->ranges, (int)tmp->range_count, tmp->rects);
                nk_rp_pack_rects((struct nk_rp_context*)baker->spc.pack_info, tmp->rects, (int)n);

                /* texture height */
                for (i = 0; i < n; ++i) {
                    if (tmp->rects[i].was_packed)
                        *height = NK_MAX(*height, tmp->rects[i].y + tmp->rects[i].h);
                }
            } while ((it = it->n) != config_iter);
        }
        NK_ASSERT(rect_n == total_glyph_count);
        NK_ASSERT(char_n == total_glyph_count);
        NK_ASSERT(range_n == total_range_count);
    }
    *height = (int)nk_round_up_pow2((nk_uint)*height);
    *image_memory = (nk_size)(*width) * (nk_size)(*height);
    return nk_true;
}